

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

void luaH_newkey(lua_State *L,Table *t,TValue *key,TValue *value)

{
  undefined8 uVar1;
  int iVar2;
  Node *pNVar3;
  TValue *io2;
  TValue *io1;
  TValue *io_;
  Node *n_;
  Node *f_1;
  Node *othern;
  TValue *io;
  lua_Integer k;
  lua_Number f;
  TValue aux;
  Node *mp;
  TValue *value_local;
  TValue *key_local;
  Table *t_local;
  lua_State *L_local;
  
  if ((key->tt_ & 0xf) == 0) {
    luaG_runerror(L,"table index is nil");
  }
  value_local = key;
  if (key->tt_ == '\x13') {
    k = (key->value_).i;
    iVar2 = luaV_flttointeger((lua_Number)k,(lua_Integer *)&io,F2Ieq);
    if (iVar2 != 0) {
      f = (lua_Number)io;
      aux.value_.ub = '\x03';
      value_local = (TValue *)&f;
    }
  }
  if ((value->tt_ & 0xf) != 0) {
    aux._8_8_ = mainpositionTV(t,value_local);
    if (((((NodeKey *)aux._8_8_)->tt_ & 0xf) != 0) || (t->lastfree == (Node *)0x0)) {
      pNVar3 = getfreepos(t);
      if (pNVar3 == (Node *)0x0) {
        rehash(L,t,value_local);
        luaH_set(L,t,value_local,value);
        return;
      }
      f_1 = mainpositionfromnode(t,(Node *)aux._8_8_);
      if (f_1 == (Node *)aux._8_8_) {
        if (*(int *)(aux._8_8_ + 0xc) != 0) {
          (pNVar3->u).next =
               (int)(((aux._8_8_ + (long)*(int *)(aux._8_8_ + 0xc) * 0x18) - (long)pNVar3) / 0x18);
        }
        *(int *)(aux._8_8_ + 0xc) = (int)(((long)pNVar3 - aux._8_8_) / 0x18);
        aux._8_8_ = pNVar3;
      }
      else {
        for (; f_1 + (f_1->u).next != (Node *)aux._8_8_; f_1 = f_1 + (f_1->u).next) {
        }
        (f_1->u).next = (int)(((long)pNVar3 - (long)f_1) / 0x18);
        (pNVar3->u).value_ = *(Value *)aux._8_8_;
        uVar1 = *(undefined8 *)(aux._8_8_ + 8);
        *(char *)((long)pNVar3 + 8) = (char)uVar1;
        *(char *)((long)pNVar3 + 9) = (char)((ulong)uVar1 >> 8);
        *(short *)((long)pNVar3 + 10) = (short)((ulong)uVar1 >> 0x10);
        *(int *)((long)pNVar3 + 0xc) = (int)((ulong)uVar1 >> 0x20);
        (pNVar3->u).key_val = *(Value *)(aux._8_8_ + 0x10);
        if (*(int *)(aux._8_8_ + 0xc) != 0) {
          (pNVar3->u).next = (int)((aux._8_8_ - (long)pNVar3) / 0x18) + (pNVar3->u).next;
          *(undefined4 *)(aux._8_8_ + 0xc) = 0;
        }
        *(undefined1 *)(aux._8_8_ + 8) = 0x10;
      }
    }
    *(Value *)(aux._8_8_ + 0x10) = value_local->value_;
    *(lu_byte *)(aux._8_8_ + 9) = value_local->tt_;
    if ((((value_local->tt_ & 0x40) != 0) && ((t->marked & 0x20) != 0)) &&
       ((((value_local->value_).gc)->marked & 0x18) != 0)) {
      luaC_barrierback_(L,(GCObject *)t);
    }
    *(Value *)aux._8_8_ = value->value_;
    *(lu_byte *)(aux._8_8_ + 8) = value->tt_;
  }
  return;
}

Assistant:

static void luaH_newkey (lua_State *L, Table *t, const TValue *key,
                                                 TValue *value) {
  Node *mp;
  TValue aux;
  if (l_unlikely(ttisnil(key)))
    luaG_runerror(L, "table index is nil");
  else if (ttisfloat(key)) {
    lua_Number f = fltvalue(key);
    lua_Integer k;
    if (luaV_flttointeger(f, &k, F2Ieq)) {  /* does key fit in an integer? */
      setivalue(&aux, k);
      key = &aux;  /* insert it as an integer */
    }
    else if (l_unlikely(luai_numisnan(f)))
      luaG_runerror(L, "table index is NaN");
  }
  if (ttisnil(value))
    return;  /* do not insert nil values */
  mp = mainpositionTV(t, key);
  if (!isempty(gval(mp)) || isdummy(t)) {  /* main position is taken? */
    Node *othern;
    Node *f = getfreepos(t);  /* get a free place */
    if (f == NULL) {  /* cannot find a free place? */
      rehash(L, t, key);  /* grow table */
      /* whatever called 'newkey' takes care of TM cache */
      luaH_set(L, t, key, value);  /* insert key into grown table */
      return;
    }
    lua_assert(!isdummy(t));
    othern = mainpositionfromnode(t, mp);
    if (othern != mp) {  /* is colliding node out of its main position? */
      /* yes; move colliding node into free position */
      while (othern + gnext(othern) != mp)  /* find previous */
        othern += gnext(othern);
      gnext(othern) = cast_int(f - othern);  /* rechain to point to 'f' */
      *f = *mp;  /* copy colliding node into free pos. (mp->next also goes) */
      if (gnext(mp) != 0) {
        gnext(f) += cast_int(mp - f);  /* correct 'next' */
        gnext(mp) = 0;  /* now 'mp' is free */
      }
      setempty(gval(mp));
    }
    else {  /* colliding node is in its own main position */
      /* new node will go into free position */
      if (gnext(mp) != 0)
        gnext(f) = cast_int((mp + gnext(mp)) - f);  /* chain new position */
      else lua_assert(gnext(f) == 0);
      gnext(mp) = cast_int(f - mp);
      mp = f;
    }
  }
  setnodekey(L, mp, key);
  luaC_barrierback(L, obj2gco(t), key);
  lua_assert(isempty(gval(mp)));
  setobj2t(L, gval(mp), value);
}